

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O3

CURLMcode curl_multi_wait(Curl_multi *multi,curl_waitfd *extra_fds,uint extra_nfds,int timeout_ms,
                         int *ret)

{
  uint uVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  undefined8 extraout_RDX;
  Curl_easy *pCVar6;
  int iVar7;
  ushort uVar8;
  int iVar9;
  uint nfds;
  pollfd *ppVar10;
  bool bVar11;
  bool bVar12;
  undefined1 auVar13 [16];
  curl_socket_t sockbunch [5];
  long timeout_internal;
  pollfd a_few_on_stack [10];
  uint local_a8 [6];
  long local_90;
  pollfd local_88 [11];
  
  uVar5 = (ulong)extra_nfds;
  if (multi == (Curl_multi *)0x0) {
    return CURLM_BAD_HANDLE;
  }
  if (multi->type != 0xbab1e) {
    return CURLM_BAD_HANDLE;
  }
  if (multi->in_callback != false) {
    return CURLM_RECURSIVE_API_CALL;
  }
  pCVar6 = multi->easyp;
  iVar7 = 0;
  if (pCVar6 != (Curl_easy *)0x0) {
    do {
      uVar1 = multi_getsock(pCVar6,(curl_socket_t *)local_a8,(int)uVar5);
      uVar3 = 0;
      do {
        if ((uVar1 >> ((uint)uVar3 & 0x1f) & 1) == 0) {
          uVar5 = 0xffffffff;
        }
        else {
          iVar7 = iVar7 + 1;
          uVar5 = (ulong)local_a8[uVar3];
        }
        if (((uVar1 >> ((byte)uVar3 & 0x1f)) >> 0x10 & 1) != 0) {
          iVar7 = iVar7 + 1;
          uVar5 = (ulong)local_a8[uVar3];
        }
      } while (((int)uVar5 != -1) && (uVar5 = uVar3 + 1, bVar11 = uVar3 < 4, uVar3 = uVar5, bVar11))
      ;
      pCVar6 = pCVar6->next;
    } while (pCVar6 != (Curl_easy *)0x0);
  }
  multi_timeout(multi,&local_90);
  iVar9 = timeout_ms;
  if (local_90 < timeout_ms) {
    iVar9 = (int)local_90;
  }
  if (local_90 < 0) {
    iVar9 = timeout_ms;
  }
  nfds = 0;
  uVar1 = iVar7 + extra_nfds;
  if (uVar1 == 0) {
    ppVar10 = (pollfd *)0x0;
  }
  else {
    if (10 < uVar1) {
      auVar13 = (undefined1  [16])(*Curl_cmalloc)((ulong)uVar1 << 3);
      if (auVar13._0_8_ == 0) {
        return CURLM_OUT_OF_MEMORY;
      }
      bVar11 = true;
      goto LAB_00434474;
    }
    ppVar10 = local_88;
  }
  auVar13._8_8_ = extraout_RDX;
  auVar13._0_8_ = ppVar10;
  bVar11 = false;
LAB_00434474:
  uVar5 = auVar13._8_8_;
  ppVar10 = auVar13._0_8_;
  if ((iVar7 != 0) && (pCVar6 = multi->easyp, pCVar6 != (Curl_easy *)0x0)) {
    uVar3 = 0;
    do {
      uVar1 = multi_getsock(pCVar6,(curl_socket_t *)local_a8,(int)uVar5);
      uVar4 = 0;
      do {
        if ((uVar1 >> ((uint)uVar4 & 0x1f) & 1) == 0) {
          uVar5 = 0xffffffff;
        }
        else {
          uVar5 = (ulong)local_a8[uVar4];
          ppVar10[uVar3].fd = local_a8[uVar4];
          ppVar10[uVar3].events = 1;
          uVar3 = (ulong)((int)uVar3 + 1);
        }
        if (((uVar1 >> ((byte)uVar4 & 0x1f)) >> 0x10 & 1) != 0) {
          uVar5 = (ulong)local_a8[uVar4];
          ppVar10[uVar3].fd = local_a8[uVar4];
          ppVar10[uVar3].events = 4;
          uVar3 = (ulong)((int)uVar3 + 1);
        }
        nfds = (uint)uVar3;
      } while (((int)uVar5 != -1) && (uVar5 = uVar4 + 1, bVar12 = uVar4 < 4, uVar4 = uVar5, bVar12))
      ;
      pCVar6 = pCVar6->next;
    } while (pCVar6 != (Curl_easy *)0x0);
  }
  if (extra_nfds != 0) {
    uVar5 = 0;
    do {
      uVar1 = nfds + (int)uVar5;
      ppVar10[uVar1].fd = extra_fds[uVar5].fd;
      uVar8 = extra_fds[uVar5].events & 1;
      ppVar10[uVar1].events = uVar8;
      if ((extra_fds[uVar5].events & 6U) != 0) {
        ppVar10[uVar1].events = uVar8 | extra_fds[uVar5].events & 6U;
      }
      uVar5 = uVar5 + 1;
    } while (extra_nfds != uVar5);
    nfds = nfds + (int)uVar5;
  }
  if (nfds == 0) {
    iVar9 = 0;
  }
  else {
    iVar2 = Curl_poll(ppVar10,nfds,iVar9);
    iVar9 = 0;
    if (0 < iVar2) {
      iVar9 = iVar2;
    }
    if (0 < iVar2 && extra_nfds != 0) {
      uVar5 = 0;
      do {
        extra_fds[uVar5].revents = ppVar10[(uint)(iVar7 + (int)uVar5)].revents & 7;
        uVar5 = uVar5 + 1;
        iVar9 = iVar2;
      } while (extra_nfds != uVar5);
    }
  }
  if (bVar11) {
    (*Curl_cfree)(ppVar10);
  }
  if (ret != (int *)0x0) {
    *ret = iVar9;
  }
  return CURLM_OK;
}

Assistant:

CURLMcode curl_multi_wait(struct Curl_multi *multi,
                          struct curl_waitfd extra_fds[],
                          unsigned int extra_nfds,
                          int timeout_ms,
                          int *ret)
{
  struct Curl_easy *data;
  curl_socket_t sockbunch[MAX_SOCKSPEREASYHANDLE];
  int bitmap;
  unsigned int i;
  unsigned int nfds = 0;
  unsigned int curlfds;
  struct pollfd *ufds = NULL;
  bool ufds_malloc = FALSE;
  long timeout_internal;
  int retcode = 0;
  struct pollfd a_few_on_stack[NUM_POLLS_ON_STACK];

  if(!GOOD_MULTI_HANDLE(multi))
    return CURLM_BAD_HANDLE;

  if(multi->in_callback)
    return CURLM_RECURSIVE_API_CALL;

  /* Count up how many fds we have from the multi handle */
  data = multi->easyp;
  while(data) {
    bitmap = multi_getsock(data, sockbunch, MAX_SOCKSPEREASYHANDLE);

    for(i = 0; i< MAX_SOCKSPEREASYHANDLE; i++) {
      curl_socket_t s = CURL_SOCKET_BAD;

      if(bitmap & GETSOCK_READSOCK(i)) {
        ++nfds;
        s = sockbunch[i];
      }
      if(bitmap & GETSOCK_WRITESOCK(i)) {
        ++nfds;
        s = sockbunch[i];
      }
      if(s == CURL_SOCKET_BAD) {
        break;
      }
    }

    data = data->next; /* check next handle */
  }

  /* If the internally desired timeout is actually shorter than requested from
     the outside, then use the shorter time! But only if the internal timer
     is actually larger than -1! */
  (void)multi_timeout(multi, &timeout_internal);
  if((timeout_internal >= 0) && (timeout_internal < (long)timeout_ms))
    timeout_ms = (int)timeout_internal;

  curlfds = nfds; /* number of internal file descriptors */
  nfds += extra_nfds; /* add the externally provided ones */

  if(nfds) {
    if(nfds > NUM_POLLS_ON_STACK) {
      /* 'nfds' is a 32 bit value and 'struct pollfd' is typically 8 bytes
         big, so at 2^29 sockets this value might wrap. When a process gets
         the capability to actually handle over 500 million sockets this
         calculation needs a integer overflow check. */
      ufds = malloc(nfds * sizeof(struct pollfd));
      if(!ufds)
        return CURLM_OUT_OF_MEMORY;
      ufds_malloc = TRUE;
    }
    else
      ufds = &a_few_on_stack[0];
  }
  nfds = 0;

  /* only do the second loop if we found descriptors in the first stage run
     above */

  if(curlfds) {
    /* Add the curl handles to our pollfds first */
    data = multi->easyp;
    while(data) {
      bitmap = multi_getsock(data, sockbunch, MAX_SOCKSPEREASYHANDLE);

      for(i = 0; i< MAX_SOCKSPEREASYHANDLE; i++) {
        curl_socket_t s = CURL_SOCKET_BAD;

        if(bitmap & GETSOCK_READSOCK(i)) {
          ufds[nfds].fd = sockbunch[i];
          ufds[nfds].events = POLLIN;
          ++nfds;
          s = sockbunch[i];
        }
        if(bitmap & GETSOCK_WRITESOCK(i)) {
          ufds[nfds].fd = sockbunch[i];
          ufds[nfds].events = POLLOUT;
          ++nfds;
          s = sockbunch[i];
        }
        if(s == CURL_SOCKET_BAD) {
          break;
        }
      }

      data = data->next; /* check next handle */
    }
  }

  /* Add external file descriptions from poll-like struct curl_waitfd */
  for(i = 0; i < extra_nfds; i++) {
    ufds[nfds].fd = extra_fds[i].fd;
    ufds[nfds].events = 0;
    if(extra_fds[i].events & CURL_WAIT_POLLIN)
      ufds[nfds].events |= POLLIN;
    if(extra_fds[i].events & CURL_WAIT_POLLPRI)
      ufds[nfds].events |= POLLPRI;
    if(extra_fds[i].events & CURL_WAIT_POLLOUT)
      ufds[nfds].events |= POLLOUT;
    ++nfds;
  }

  if(nfds) {
    int pollrc;
    /* wait... */
    pollrc = Curl_poll(ufds, nfds, timeout_ms);

    if(pollrc > 0) {
      retcode = pollrc;
      /* copy revents results from the poll to the curl_multi_wait poll
         struct, the bit values of the actual underlying poll() implementation
         may not be the same as the ones in the public libcurl API! */
      for(i = 0; i < extra_nfds; i++) {
        unsigned short mask = 0;
        unsigned r = ufds[curlfds + i].revents;

        if(r & POLLIN)
          mask |= CURL_WAIT_POLLIN;
        if(r & POLLOUT)
          mask |= CURL_WAIT_POLLOUT;
        if(r & POLLPRI)
          mask |= CURL_WAIT_POLLPRI;

        extra_fds[i].revents = mask;
      }
    }
  }

  if(ufds_malloc)
    free(ufds);
  if(ret)
    *ret = retcode;
  return CURLM_OK;
}